

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O3

void __thiscall
google::protobuf::internal::ImplicitWeakMessage::ImplicitWeakMessage
          (ImplicitWeakMessage *this,Arena *arena)

{
  string *psVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = (intptr_t)arena;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ImplicitWeakMessage_00455460;
  if (arena == (Arena *)0x0) {
    psVar1 = (string *)operator_new(0x20);
  }
  else {
    psVar1 = (string *)ThreadSafeArena::AllocateFromStringBlock(&arena->impl_);
  }
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  psVar1->_M_string_length = 0;
  (psVar1->field_2)._M_local_buf[0] = '\0';
  this->data_ = psVar1;
  (this->cached_size_).atom_ = 0;
  return;
}

Assistant:

explicit ImplicitWeakMessage(Arena* arena)
      : MessageLite(arena, class_data_.base()),
        data_(Arena::Create<std::string>(arena)) {}